

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O3

vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> * __thiscall
AssemblyCode::SubRegRegCommand::GetIn
          (vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *__return_storage_ptr__,
          SubRegRegCommand *this)

{
  pointer pcVar1;
  long lVar2;
  initializer_list<IRT::CTemp> __l;
  allocator_type local_61;
  CTemp local_60;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_60.name._M_dataplus._M_p = (pointer)&local_60.name.field_2;
  pcVar1 = (this->leftOperand).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (this->leftOperand).name._M_string_length);
  local_40[0] = local_30;
  pcVar1 = (this->rightOperand).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + (this->rightOperand).name._M_string_length);
  __l._M_len = 2;
  __l._M_array = &local_60;
  std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::vector(__return_storage_ptr__,__l,&local_61)
  ;
  lVar2 = 0;
  do {
    if (local_30 + lVar2 != *(undefined1 **)((long)local_40 + lVar2)) {
      operator_delete(*(undefined1 **)((long)local_40 + lVar2));
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<IRT::CTemp> AssemblyCode::SubRegRegCommand::GetIn( ) const {
    return { leftOperand, rightOperand };
}